

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O0

bool __thiscall WellFounded::propagate(WellFounded *this)

{
  int iVar1;
  FILE *__stream;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  int *piVar7;
  vec<int> *pvVar8;
  vec<ConjRule_*> *pvVar9;
  bool *pbVar10;
  Lit *pLVar11;
  ConjRule **ppCVar12;
  long in_RDI;
  int h_3;
  uint i_11;
  uint i_10;
  Clause *expl;
  ConjRule *r_2;
  uint i_9;
  int h_2;
  uint i_8;
  vec<Lit> ps;
  int h_1;
  uint i_7;
  uint i_6;
  ConjRule *r_1;
  uint i_5;
  int x_2;
  ConjRule *r;
  uint i_4;
  uint k;
  int h;
  uint uf;
  int nfshead;
  uint i_3;
  int x_1;
  uint i_2;
  int start;
  uint j;
  int x;
  uint i_1;
  uint i;
  int in_stack_fffffffffffffe2c;
  undefined2 in_stack_fffffffffffffe30;
  byte in_stack_fffffffffffffe32;
  undefined4 in_stack_fffffffffffffe33;
  undefined1 in_stack_fffffffffffffe37;
  undefined1 x_00;
  BoolView *in_stack_fffffffffffffe38;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  BoolView *in_stack_fffffffffffffe68;
  vec<vec<ConjRule_*>_> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  undefined1 *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  byte local_13d;
  Reason local_f8;
  int local_ec;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  Clause *local_c8;
  ConjRule *local_c0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  vec<Lit> local_a8;
  uint local_94;
  uint local_90;
  uint local_8c;
  ConjRule *local_88;
  uint local_80;
  uint local_7c;
  ConjRule *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  byte local_45;
  int local_44;
  undefined1 local_40 [20];
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  byte local_1;
  
  for (local_14 = 0; uVar4 = local_14, uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x1f0)),
      uVar4 < uVar3; local_14 = local_14 + 1) {
    puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x1f0),local_14);
    vec<ConjRule_*>::operator[]((vec<ConjRule_*> *)(in_RDI + 0x68),*puVar6);
    killSupport((WellFounded *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                (ConjRule *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  for (local_18 = 0; uVar4 = local_18,
      uVar3 = vec<vec<int>_>::size((vec<vec<int>_> *)(in_RDI + 0x1b0)), uVar4 < uVar3;
      local_18 = local_18 + 1) {
    while( true ) {
      piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x1d0),local_18);
      iVar1 = *piVar7;
      pvVar8 = vec<vec<int>_>::operator[]((vec<vec<int>_> *)(in_RDI + 0x1b0),local_18);
      uVar4 = vec<int>::size(pvVar8);
      if ((int)uVar4 <= iVar1) break;
      pvVar8 = vec<vec<int>_>::operator[]((vec<vec<int>_> *)(in_RDI + 0x1b0),local_18);
      puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x1d0),local_18);
      uVar4 = *puVar6;
      *puVar6 = uVar4 + 1;
      puVar6 = (uint *)vec<int>::operator[](pvVar8,uVar4);
      local_1c = *puVar6;
      local_20 = 0;
      while( true ) {
        uVar4 = local_20;
        pvVar9 = vec<vec<ConjRule_*>_>::operator[]
                           ((vec<vec<ConjRule_*>_> *)(in_RDI + 0x128),local_1c);
        uVar3 = vec<ConjRule_*>::size(pvVar9);
        if (uVar3 <= uVar4) break;
        pvVar9 = vec<vec<ConjRule_*>_>::operator[]
                           ((vec<vec<ConjRule_*>_> *)(in_RDI + 0x128),local_1c);
        vec<ConjRule_*>::operator[](pvVar9,local_20);
        killSupport((WellFounded *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (ConjRule *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_20 = local_20 + 1;
      }
    }
  }
  local_24 = 0xffffffff;
  for (local_28 = 0; uVar4 = local_28,
      uVar3 = vec<vec<int>_>::size((vec<vec<int>_> *)(in_RDI + 0x1b0)), uVar4 < uVar3;
      local_28 = local_28 + 1) {
    while( true ) {
      piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x1e0),local_28);
      iVar1 = *piVar7;
      pvVar8 = vec<vec<int>_>::operator[]((vec<vec<int>_> *)(in_RDI + 0x1b0),local_28);
      uVar4 = vec<int>::size(pvVar8);
      if ((int)uVar4 <= iVar1) break;
      pvVar8 = vec<vec<int>_>::operator[]((vec<vec<int>_> *)(in_RDI + 0x1b0),local_28);
      puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x1e0),local_28);
      puVar6 = (uint *)vec<int>::operator[](pvVar8,*puVar6);
      local_2c = *puVar6;
      pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),local_2c);
      local_45 = 0;
      local_13d = 0;
      if ((*pbVar10 & 1U) != 0) {
        pLVar11 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x58),local_2c);
        local_44 = pLVar11->x;
        in_stack_fffffffffffffea8 = local_40;
        BoolView::BoolView(in_stack_fffffffffffffe68,
                           (Lit)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
        local_45 = 1;
        in_stack_fffffffffffffeb7 =
             BoolView::isFalse((BoolView *)
                               CONCAT17(in_stack_fffffffffffffe37,
                                        CONCAT43(in_stack_fffffffffffffe33,
                                                 CONCAT12(in_stack_fffffffffffffe32,
                                                          in_stack_fffffffffffffe30))));
        local_13d = in_stack_fffffffffffffeb7 ^ 0xff;
      }
      in_stack_fffffffffffffea4 = CONCAT13(local_13d,(int3)in_stack_fffffffffffffea4);
      if ((local_45 & 1) != 0) {
        BoolView::~BoolView((BoolView *)0x2b844e);
      }
      if ((in_stack_fffffffffffffea4 & 0x1000000) != 0) {
        local_24 = local_2c;
        break;
      }
      piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x1e0),local_28);
      *piVar7 = *piVar7 + 1;
    }
    if (local_24 != 0xffffffff) break;
  }
  if (local_24 == 0xffffffff) {
    local_58 = 0;
    while (uVar4 = local_58, uVar3 = vec<vec<int>_>::size((vec<vec<int>_> *)(in_RDI + 0x1b0)),
          uVar4 < uVar3) {
      vec<vec<int>_>::operator[]((vec<vec<int>_> *)(in_RDI + 0x1b0),local_58);
      vec<int>::clear((vec<int> *)
                      CONCAT17(in_stack_fffffffffffffe37,
                               CONCAT43(in_stack_fffffffffffffe33,
                                        CONCAT12(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30
                                                ))),SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0)
                     );
      piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x1d0),local_58);
      *piVar7 = 0;
      piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x1e0),local_58);
      *piVar7 = 0;
      local_58 = local_58 + 1;
    }
    local_1 = 1;
  }
  else {
    vec<int>::clear((vec<int> *)
                    CONCAT17(in_stack_fffffffffffffe37,
                             CONCAT43(in_stack_fffffffffffffe33,
                                      CONCAT12(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30))
                            ),SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0));
    vec<int>::push((vec<int> *)in_stack_fffffffffffffe40._pt,(int *)in_stack_fffffffffffffe38);
    pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x210),local_24);
    *pbVar10 = true;
    vec<int>::clear((vec<int> *)
                    CONCAT17(in_stack_fffffffffffffe37,
                             CONCAT43(in_stack_fffffffffffffe33,
                                      CONCAT12(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30))
                            ),SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0));
    local_5c = 0;
    for (local_60 = 0; uVar4 = local_60, uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x200)),
        uVar4 < uVar3; local_60 = local_60 + 1) {
      puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x200),local_60);
      local_64 = *puVar6;
      pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),local_64);
      if ((*pbVar10 & 1U) == 0) {
        fprintf(_stderr,"not no_support %d!\n",(ulong)local_64);
        for (local_68 = 0; uVar4 = local_68, uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x200)),
            __stream = _stderr, uVar4 < uVar3; local_68 = local_68 + 1) {
          puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x200),local_68);
          fprintf(__stream,"%d ",(ulong)*puVar6);
        }
        fprintf(_stderr,"- %d %d\n",(ulong)local_60,(ulong)local_64);
      }
      local_6c = 0;
      while( true ) {
        uVar4 = local_6c;
        pvVar9 = vec<vec<ConjRule_*>_>::operator[]
                           ((vec<vec<ConjRule_*>_> *)(in_RDI + 0x118),local_64);
        uVar3 = vec<ConjRule_*>::size(pvVar9);
        if (uVar3 <= uVar4) break;
        pvVar9 = vec<vec<ConjRule_*>_>::operator[]
                           ((vec<vec<ConjRule_*>_> *)(in_RDI + 0x118),local_64);
        ppCVar12 = vec<ConjRule_*>::operator[](pvVar9,local_6c);
        local_78 = *ppCVar12;
        bVar2 = ConjRule::isFalse((ConjRule *)
                                  CONCAT17(in_stack_fffffffffffffe37,
                                           CONCAT43(in_stack_fffffffffffffe33,
                                                    CONCAT12(in_stack_fffffffffffffe32,
                                                             in_stack_fffffffffffffe30))));
        if (!bVar2) {
          local_78->w = local_78->sz + -1;
          bVar2 = propRule((WellFounded *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           (ConjRule *)in_stack_fffffffffffffe40._pt);
          if (bVar2) break;
        }
        local_6c = local_6c + 1;
      }
      while (uVar4 = local_5c, uVar5 = vec<int>::size((vec<int> *)(in_RDI + 0x220)),
            uVar3 = local_5c, (int)uVar4 < (int)uVar5) {
        local_5c = local_5c + 1;
        puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x220),uVar3);
        local_7c = *puVar6;
        local_80 = 0;
        while( true ) {
          uVar4 = local_80;
          pvVar9 = vec<vec<ConjRule_*>_>::operator[]
                             ((vec<vec<ConjRule_*>_> *)(in_RDI + 0x138),local_7c);
          uVar3 = vec<ConjRule_*>::size(pvVar9);
          if (uVar3 <= uVar4) break;
          pvVar9 = vec<vec<ConjRule_*>_>::operator[]
                             ((vec<vec<ConjRule_*>_> *)(in_RDI + 0x138),local_7c);
          ppCVar12 = vec<ConjRule_*>::operator[](pvVar9,local_80);
          local_88 = *ppCVar12;
          pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),local_88->head);
          if (((*pbVar10 & 1U) != 0) &&
             (bVar2 = ConjRule::isFalse((ConjRule *)
                                        CONCAT17(in_stack_fffffffffffffe37,
                                                 CONCAT43(in_stack_fffffffffffffe33,
                                                          CONCAT12(in_stack_fffffffffffffe32,
                                                                   in_stack_fffffffffffffe30)))),
             !bVar2)) {
            local_88->w = local_88->w + -1;
            propRule((WellFounded *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     (ConjRule *)in_stack_fffffffffffffe40._pt);
          }
          local_80 = local_80 + 1;
        }
        vec<vec<ConjRule_*>_>::operator[]((vec<vec<ConjRule_*>_> *)(in_RDI + 0x138),local_7c);
        vec<ConjRule_*>::clear
                  ((vec<ConjRule_*> *)
                   CONCAT17(in_stack_fffffffffffffe37,
                            CONCAT43(in_stack_fffffffffffffe33,
                                     CONCAT12(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30)))
                   ,SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0));
      }
    }
    *(undefined4 *)(in_RDI + 0x148) = 0;
    local_8c = 0;
    while (uVar4 = local_8c, uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x170)), uVar4 < uVar3) {
      piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x170),local_8c);
      *piVar7 = -1;
      piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x180),local_8c);
      *piVar7 = -1;
      local_8c = local_8c + 1;
    }
    vec<vec<int>_>::clear
              ((vec<vec<int>_> *)
               CONCAT17(in_stack_fffffffffffffe37,
                        CONCAT43(in_stack_fffffffffffffe33,
                                 CONCAT12(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30))),
               SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0));
    local_90 = 0;
    while (uVar4 = local_90, uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x200)), uVar4 < uVar3) {
      puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x200),local_90);
      local_94 = *puVar6;
      pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),local_94);
      if (((*pbVar10 & 1U) != 0) &&
         (piVar7 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x170),local_94), *piVar7 == -1)) {
        strongconnect((WellFounded *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                      (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                      (_func_void_WellFounded_ptr_int_vec<int>_ptr *)
                      CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      }
      local_90 = local_90 + 1;
    }
    vec<Lit>::vec((vec<Lit> *)in_stack_fffffffffffffe40._pt,
                  (uint)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    local_ac = 0;
    while (uVar4 = local_ac, uVar3 = vec<int>::size((vec<int> *)(in_RDI + 0x200)), uVar4 < uVar3) {
      in_stack_fffffffffffffe68 = (BoolView *)(in_RDI + 0x200);
      puVar6 = (uint *)vec<int>::operator[]((vec<int> *)in_stack_fffffffffffffe68,local_ac);
      pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x210),*puVar6);
      *pbVar10 = false;
      in_stack_fffffffffffffe70 = (vec<vec<ConjRule_*>_> *)(in_RDI + 0x138);
      puVar6 = (uint *)vec<int>::operator[]((vec<int> *)in_stack_fffffffffffffe68,local_ac);
      vec<vec<ConjRule_*>_>::operator[](in_stack_fffffffffffffe70,*puVar6);
      vec<ConjRule_*>::clear
                ((vec<ConjRule_*> *)
                 CONCAT17(in_stack_fffffffffffffe37,
                          CONCAT43(in_stack_fffffffffffffe33,
                                   CONCAT12(in_stack_fffffffffffffe32,in_stack_fffffffffffffe30))),
                 SUB41((uint)in_stack_fffffffffffffe2c >> 0x18,0));
      puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x200),local_ac);
      local_b0 = *puVar6;
      pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),local_b0);
      if ((*pbVar10 & 1U) != 0) {
        local_b4 = 0;
        while( true ) {
          uVar4 = local_b4;
          pvVar9 = vec<vec<ConjRule_*>_>::operator[]
                             ((vec<vec<ConjRule_*>_> *)(in_RDI + 0x118),local_b0);
          uVar3 = vec<ConjRule_*>::size(pvVar9);
          if (uVar3 <= uVar4) break;
          pvVar9 = vec<vec<ConjRule_*>_>::operator[]
                             ((vec<vec<ConjRule_*>_> *)(in_RDI + 0x118),local_b0);
          ppCVar12 = vec<ConjRule_*>::operator[](pvVar9,local_b4);
          local_c0 = *ppCVar12;
          bVar2 = ConjRule::isFalse((ConjRule *)
                                    CONCAT17(in_stack_fffffffffffffe37,
                                             CONCAT43(in_stack_fffffffffffffe33,
                                                      CONCAT12(in_stack_fffffffffffffe32,
                                                               in_stack_fffffffffffffe30))));
          if (bVar2) {
            vec<Lit>::push((vec<Lit> *)in_stack_fffffffffffffe40._pt,
                           (Lit *)in_stack_fffffffffffffe38);
          }
          local_b4 = local_b4 + 1;
        }
      }
      local_ac = local_ac + 1;
    }
    vec<Lit>::size(&local_a8);
    local_c8 = ::Reason_new(CONCAT13(in_stack_fffffffffffffe37,
                                     (int3)((uint)in_stack_fffffffffffffe33 >> 8)));
    local_cc = 1;
    while (uVar4 = local_cc, uVar3 = vec<Lit>::size(&local_a8), uVar4 < uVar3) {
      in_stack_fffffffffffffe38 = (BoolView *)vec<Lit>::operator[](&local_a8,local_cc);
      in_stack_fffffffffffffe40._pt =
           (Clause *)
           Clause::operator[]((Clause *)
                              CONCAT17(in_stack_fffffffffffffe37,
                                       CONCAT43(in_stack_fffffffffffffe33,
                                                CONCAT12(in_stack_fffffffffffffe32,
                                                         in_stack_fffffffffffffe30))),
                              in_stack_fffffffffffffe2c);
      *(int *)in_stack_fffffffffffffe40._pt =
           *(int *)&(in_stack_fffffffffffffe38->super_Var).super_Branching._vptr_Branching;
      local_cc = local_cc + 1;
    }
    local_d0 = 0;
    while( true ) {
      in_stack_fffffffffffffe33 = CONCAT31((int3)local_d0,(char)in_stack_fffffffffffffe33);
      x_00 = (undefined1)(local_d0 >> 0x18);
      uVar4 = vec<int>::size((vec<int> *)(in_RDI + 0x200));
      if (uVar4 <= CONCAT13(x_00,(int3)((uint)in_stack_fffffffffffffe33 >> 8))) break;
      puVar6 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x200),local_d0);
      local_d4 = *puVar6;
      pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),local_d4);
      if ((*pbVar10 & 1U) != 0) {
        pLVar11 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x58),local_d4);
        local_ec = pLVar11->x;
        BoolView::BoolView(in_stack_fffffffffffffe68,
                           (Lit)(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
        Reason::Reason(&local_f8,local_c8);
        bVar2 = BoolView::setVal(in_stack_fffffffffffffe38,(bool)x_00,
                                 (Reason)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe33 = CONCAT31((int3)((uint)in_stack_fffffffffffffe33 >> 8),bVar2);
        in_stack_fffffffffffffe32 = bVar2 ^ 0xff;
        BoolView::~BoolView((BoolView *)0x2b8f1a);
        if ((in_stack_fffffffffffffe32 & 1) != 0) {
          local_1 = 0;
          goto LAB_002b8fe7;
        }
        pbVar10 = vec<bool>::operator[]((vec<bool> *)(in_RDI + 0x1c0),local_d4);
        *pbVar10 = false;
      }
      local_d0 = local_d0 + 1;
    }
    vec<vec<Propagator_*>_>::operator[](&engine.p_queue,*(uint *)(in_RDI + 0xc));
    vec<Propagator_*>::push
              ((vec<Propagator_*> *)in_stack_fffffffffffffe40._pt,
               (Propagator **)in_stack_fffffffffffffe38);
    local_1 = 1;
LAB_002b8fe7:
    vec<Lit>::~vec((vec<Lit> *)
                   CONCAT17(x_00,CONCAT43(in_stack_fffffffffffffe33,
                                          CONCAT12(in_stack_fffffffffffffe32,
                                                   in_stack_fffffffffffffe30))));
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool propagate() override {
		// find all unsupported
		if (DEBUG) {
			printf("propagating\n");
		}

		for (unsigned int i = 0; i < dead_rules.size(); i++) {
			killSupport(rules[dead_rules[i]]);
		}

		for (unsigned int i = 0; i < no_support.size(); i++) {
			while (ushead[i] < static_cast<int>(no_support[i].size())) {
				const int x = no_support[i][ushead[i]++];
				for (unsigned int j = 0; j < body_occ_rules[x].size(); j++) {
					killSupport(body_occ_rules[x][j]);
				}
			}
		}

		if (DEBUG) {
			printf("Decision level: %d\n", engine.decisionLevel());
		}

		if (DEBUG) {
			printf("No support: ");
		}
		if (DEBUG) {
			for (unsigned int i = 0; i < no_support.size(); i++) {
				for (unsigned int j = 0; j < no_support[i].size(); j++) {
					printf("%d, ", no_support[i][j]);
				}
			}
		}
		if (DEBUG) {
			printf("\n");
		}

		int start = -1;
		// pick one to start building unfounded set
		for (unsigned int i = 0; i < no_support.size(); i++) {
			for (; pufhead[i] < static_cast<int>(no_support[i].size()); pufhead[i]++) {
				const int x = no_support[i][pufhead[i]];
				if (no_support_bool[x] && !BoolView(lits[x]).isFalse()) {
					start = x;
					break;
				}
			}
			if (start != -1) {
				break;
			}
		}

		// if all processed, we're done
		if (start == -1) {
			if (DEBUG) {
				printf("all done\n");
			}
			for (unsigned int i = 0; i < no_support.size(); i++) {
				no_support[i].clear();
				ushead[i] = 0;
				pufhead[i] = 0;
			}
			return true;
		}

		// start building unfounded set

		ufset.clear();
		ufset.push(start);
		ufset_bool[start] = true;

		if (DEBUG) {
			printf("starting with %d\n", start);
		}

		nfset.clear();
		int nfshead = 0;

		for (unsigned int uf = 0; uf < ufset.size(); uf++) {
			const int h = ufset[uf];
			if (!no_support_bool[h]) {
				fprintf(stderr, "not no_support %d!\n", h);
				for (unsigned int k = 0; k < ufset.size(); k++) {
					fprintf(stderr, "%d ", ufset[k]);
				}
				fprintf(stderr, "- %d %d\n", uf, h);
			}
			assert(no_support_bool[h]);
			// add rules with h as head
			for (unsigned int i = 0; i < head_occ_rules[h].size(); i++) {
				if (DEBUG) {
					printf("checking %dth rule for %d\n", i, h);
				}
				ConjRule* r = head_occ_rules[h][i];
				if (r->isFalse()) {
					continue;
				}
				r->w = r->sz - 1;
				if (DEBUG) {
					printf("proping rule\n");
				}
				if (propRule(*r)) {
					break;
				}
			}

			// propagate nfset

			while (nfshead < static_cast<int>(nfset.size())) {
				const int x = nfset[nfshead++];
				for (unsigned int i = 0; i < watches[x].size(); i++) {
					ConjRule* r = watches[x][i];
					// if head already founded by another rule, ignore
					if (!no_support_bool[r->head]) {
						continue;
					}
					if (r->isFalse()) {
						continue;
					}
					r->w--;
					propRule(*r);
				}
				watches[x].clear();
			}
		}

		// we have now found an unfounded set! i.e., everything in ufset which is still not justified

		// if empty, should jump straight back up!

		// calc dynamic SCC
		//		fprintf(stderr, "calc Dyn SCC\n");

		index = 0;
		assert(S.size() == 0);
		for (unsigned int i = 0; i < indices.size(); i++) {
			indices[i] = -1;
			lowlink[i] = -1;
		}
		sccs.clear();

		for (unsigned int i = 0; i < ufset.size(); i++) {
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			if (indices[h] != -1) {
				continue;
			}
			//			fprintf(stderr, "root %d ", h);
			strongconnect(h, &getDynamicEdges);
		}

		assert(S.size() == 0);

		//		if (sccs.size() > 0) fprintf(stderr, "d %d ", sccs.size());

		// create an explanation

		vec<Lit> ps(1);

		for (unsigned int i = 0; i < ufset.size(); i++) {
			ufset_bool[ufset[i]] = false;
			watches[ufset[i]].clear();
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			for (unsigned int i = 0; i < head_occ_rules[h].size(); i++) {
				ConjRule* r = head_occ_rules[h][i];
				if (r->isFalse()) {
					ps.push(r->body_lit);
				}
			}
		}

		Clause* expl = Reason_new(ps.size());
		for (unsigned int i = 1; i < ps.size(); i++) {
			(*expl)[i] = ps[i];
		}
		for (unsigned int i = 0; i < ufset.size(); i++) {
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			if (DEBUG) {
				printf("making %d false\n", h);
			}
			if (ADD_CLAUSES) {
				ps[0] = ~lits[h];
				sat.addClause(*Clause_new(ps, false), false);
			}
			assert(!BoolView(lits[h]).isFalse());
			if (!BoolView(lits[h]).setVal(false, expl)) {
				return false;
			}
			no_support_bool[h] = false;
		}

		if (DEBUG) {
			printf("reawaken\n");
		}

		// reawaken, this is not quite correct
		engine.p_queue[priority].push(this);

		return true;
	}